

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O2

bool __thiscall
sptk::StatisticsAccumulation::GetCorrelation
          (StatisticsAccumulation *this,Buffer *buffer,SymmetricMatrix *correlation)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pdVar4;
  bool bVar5;
  double *pdVar6;
  long lVar7;
  int j;
  long lVar8;
  int i;
  long lVar9;
  vector<double,_std::allocator<double>_> standard_deviation;
  Row local_60;
  Row local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (this->num_statistics_order_ < 2) {
    return false;
  }
  if (correlation == (SymmetricMatrix *)0x0) {
    return false;
  }
  if (this->diagonal_ == false) {
    standard_deviation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    standard_deviation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    standard_deviation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar5 = GetStandardDeviation(this,buffer,&standard_deviation);
    if ((bVar5) &&
       (bVar5 = GetFullCovariance(this,buffer,correlation),
       pdVar4 = standard_deviation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start, bVar5)) {
      lVar7 = 1;
      for (lVar9 = 0; lVar9 <= this->num_order_; lVar9 = lVar9 + 1) {
        for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 1) {
          local_48._vptr_Row = (_func_int **)&PTR__Row_00115c40;
          local_48.matrix_ = correlation;
          local_48.row_ = (int)lVar9;
          pdVar6 = SymmetricMatrix::Row::operator[](&local_48,(int)lVar8);
          dVar1 = *pdVar6;
          dVar2 = pdVar4[lVar9];
          dVar3 = pdVar4[lVar8];
          local_60._vptr_Row = (_func_int **)&PTR__Row_00115c40;
          local_60.matrix_ = correlation;
          local_60.row_ = (int)lVar9;
          pdVar6 = SymmetricMatrix::Row::operator[](&local_60,(int)lVar8);
          *pdVar6 = dVar1 / (dVar2 * dVar3);
        }
        lVar7 = lVar7 + 1;
      }
      bVar5 = true;
    }
    else {
      bVar5 = false;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&standard_deviation.super__Vector_base<double,_std::allocator<double>_>);
    return bVar5;
  }
  return false;
}

Assistant:

bool StatisticsAccumulation::GetCorrelation(
    const StatisticsAccumulation::Buffer& buffer,
    SymmetricMatrix* correlation) const {
  if (!is_valid_ || num_statistics_order_ < 2 || diagonal_ ||
      NULL == correlation) {
    return false;
  }

  std::vector<double> standard_deviation;
  if (!GetStandardDeviation(buffer, &standard_deviation)) {
    return false;
  }
  if (!GetFullCovariance(buffer, correlation)) {
    return false;
  }

  const double* sigma(&(standard_deviation[0]));
  for (int i(0); i <= num_order_; ++i) {
    for (int j(0); j <= i; ++j) {
      (*correlation)[i][j] = (*correlation)[i][j] / (sigma[i] * sigma[j]);
    }
  }

  return true;
}